

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sender.cc
# Opt level: O0

base_learner * sender_setup(options_i *options,vw *all)

{
  byte bVar1;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  pointer psVar2;
  learner<sender,_example> *this_00;
  learner<sender,_example> *this_01;
  vw *in_RSI;
  long *in_RDI;
  learner<sender,_example> *l;
  free_ptr<sender> s;
  option_group_definition sender_options;
  string host;
  string *in_stack_fffffffffffffd88;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd90;
  string *in_stack_fffffffffffffd98;
  _func_void_sender_ptr_learner<char,_example>_ptr_example_ptr *learn;
  free_ptr<sender> *in_stack_fffffffffffffda0;
  learner<sender,_example> *this_02;
  string *in_stack_fffffffffffffda8;
  sender *in_stack_fffffffffffffdb0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdd8;
  allocator *paVar3;
  string local_1f0 [32];
  undefined1 local_1d0 [16];
  undefined4 local_1c0;
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  size_t in_stack_ffffffffffffff58;
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [56];
  string local_38 [32];
  vw *local_18;
  long *local_10;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::__cxx11::string::string(local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"Network sending",&local_91);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"sendto",&local_169);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffffd98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd90);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(&local_148,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"send examples to <host>",&local_191);
  this = VW::config::
         typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::help(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            ((option_group_definition *)this,in_stack_fffffffffffffdd8);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_fffffffffffffd90);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  (**(code **)*local_10)(local_10,local_70);
  paVar3 = &local_1b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"sendto",paVar3);
  bVar1 = (**(code **)(*local_10 + 8))(local_10,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    scoped_calloc_or_throw<sender>();
    psVar2 = std::unique_ptr<sender,_void_(*)(void_*)>::operator->
                       ((unique_ptr<sender,_void_(*)(void_*)> *)0x2bad60);
    psVar2->sd = -1;
    std::unique_ptr<sender,_void_(*)(void_*)>::get
              ((unique_ptr<sender,_void_(*)(void_*)> *)in_stack_fffffffffffffd90);
    std::__cxx11::string::string(local_1f0,local_38);
    open_sockets(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    std::__cxx11::string::~string(local_1f0);
    psVar2 = std::unique_ptr<sender,_void_(*)(void_*)>::operator->
                       ((unique_ptr<sender,_void_(*)(void_*)> *)0x2badc8);
    psVar2->all = local_18;
    this_00 = (learner<sender,_example> *)calloc_or_throw<example*>(in_stack_ffffffffffffff58);
    learn = (_func_void_sender_ptr_learner<char,_example>_ptr_example_ptr *)local_1d0;
    psVar2 = std::unique_ptr<sender,_void_(*)(void_*)>::operator->
                       ((unique_ptr<sender,_void_(*)(void_*)> *)0x2bae02);
    psVar2->delay_ring = (example **)this_00;
    this_01 = LEARNER::init_learner<sender,example,LEARNER::learner<char,example>>
                        (in_stack_fffffffffffffda0,learn,
                         (_func_void_sender_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffffd90,(size_t)in_stack_fffffffffffffd88);
    this_02 = this_01;
    LEARNER::learner<sender,_example>::set_finish(this_00,(_func_void_sender_ptr *)local_18);
    LEARNER::learner<sender,_example>::set_finish_example(this_01,finish_example);
    LEARNER::learner<sender,_example>::set_end_examples(this_00,(_func_void_sender_ptr *)local_18);
    in_stack_fffffffffffffd90 =
         (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)LEARNER::make_base<sender,example>(this_01);
    local_1c0 = 1;
    local_8 = in_stack_fffffffffffffd90;
    std::unique_ptr<sender,_void_(*)(void_*)>::~unique_ptr
              ((unique_ptr<sender,_void_(*)(void_*)> *)this_02);
  }
  else {
    local_8 = (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
    local_1c0 = 1;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd90);
  std::__cxx11::string::~string(local_38);
  return (base_learner *)local_8;
}

Assistant:

LEARNER::base_learner* sender_setup(options_i& options, vw& all)
{
  string host;

  option_group_definition sender_options("Network sending");
  sender_options.add(make_option("sendto", host).keep().help("send examples to <host>"));
  options.add_and_parse(sender_options);

  if (!options.was_supplied("sendto"))
  {
    return nullptr;
  }

  auto s = scoped_calloc_or_throw<sender>();
  s->sd = -1;
  open_sockets(*s.get(), host);

  s->all = &all;
  s->delay_ring = calloc_or_throw<example*>(all.p->ring_size);

  LEARNER::learner<sender, example>& l = init_learner(s, learn, learn, 1);
  l.set_finish(finish);
  l.set_finish_example(finish_example);
  l.set_end_examples(end_examples);
  return make_base(l);
}